

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  unsigned_short connectport;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  int *piVar11;
  char *pcVar12;
  uint *puVar13;
  FILE *__stream;
  ssize_t sVar14;
  size_t sVar15;
  ushort connectport_00;
  socklen_t __len;
  ulong *puVar16;
  char cVar17;
  uchar uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  perclient *cp;
  char *pcVar23;
  ulong __n;
  undefined8 uVar24;
  char key [32];
  curl_socklen_t la_size;
  uchar buffer [272];
  fd_set fds_err;
  fd_set fds_write;
  int flag;
  char *endptr;
  int local_68c;
  undefined4 local_678;
  char cStack_674;
  undefined2 uStack_673;
  undefined1 uStack_671;
  int local_670;
  undefined1 uStack_66c;
  char *local_658;
  ulong local_650;
  ulong local_648 [2];
  uint local_638 [2];
  ulong auStack_630 [5];
  char local_608 [40];
  ulong local_5e0;
  fd_set local_5d8;
  sockaddr local_558 [17];
  fd_set local_448;
  fd_set local_3c8;
  undefined4 local_348;
  undefined2 local_344 [134];
  sockaddr local_238;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  
  if (argc < 2) {
    pcVar23 = ".socksd.pid";
  }
  else {
    pcVar23 = ".socksd.pid";
    iVar7 = 1;
    do {
      pcVar12 = argv[iVar7];
      iVar5 = strcmp("--version",pcVar12);
      if (iVar5 == 0) {
        curl_mprintf("socksd IPv4%s\n","/IPv6");
        return 0;
      }
      iVar5 = strcmp("--pidfile",pcVar12);
      if (iVar5 == 0) {
        iVar5 = iVar7 + 1;
        if (iVar5 < argc) {
          pcVar23 = argv[iVar5];
          iVar5 = iVar7 + 2;
        }
      }
      else {
        iVar5 = strcmp("--config",pcVar12);
        if (iVar5 == 0) {
          iVar5 = iVar7 + 1;
          if (iVar5 < argc) {
            configfile = argv[iVar5];
            iVar5 = iVar7 + 2;
          }
        }
        else {
          iVar5 = strcmp("--backend",pcVar12);
          if (iVar5 == 0) {
            iVar5 = iVar7 + 1;
            if (iVar5 < argc) {
              backendaddr = argv[iVar5];
              iVar5 = iVar7 + 2;
            }
          }
          else {
            iVar5 = strcmp("--backendport",pcVar12);
            if (iVar5 == 0) {
              iVar5 = iVar7 + 1;
              if (iVar5 < argc) {
                iVar5 = atoi(argv[iVar5]);
                backendport = (unsigned_short)iVar5;
                iVar5 = iVar7 + 2;
              }
            }
            else {
              iVar5 = strcmp("--logfile",pcVar12);
              if (iVar5 == 0) {
                iVar5 = iVar7 + 1;
                if (iVar5 < argc) {
                  serverlogfile = argv[iVar5];
                  iVar5 = iVar7 + 2;
                }
              }
              else {
                iVar5 = strcmp("--ipv6",pcVar12);
                if (iVar5 == 0) {
                  ipv_inuse = "IPv6";
                  use_ipv6 = 1;
                }
                else {
                  iVar5 = strcmp("--ipv4",pcVar12);
                  if (iVar5 != 0) {
                    iVar5 = strcmp("--port",pcVar12);
                    if (iVar5 != 0) {
                      puts(
                          "Usage: socksd [option]\n --backend [ipv4 addr]\n --backendport [TCP port]\n --config [file]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --bindonly\n --port [port]\n"
                          );
                      return 0;
                    }
                    iVar5 = iVar7 + 1;
                    if (iVar5 < argc) {
                      local_658 = pcVar23;
                      uVar9 = strtoul(argv[iVar5],(char **)&local_238,10);
                      pcVar12 = (char *)CONCAT26(local_238.sa_data._4_2_,
                                                 CONCAT24(local_238.sa_data._2_2_,
                                                          CONCAT22(local_238.sa_data._0_2_,
                                                                   CONCAT11(local_238.sa_family.
                                                                            _1_1_,(undefined1)
                                                                                  local_238.
                                                                                  sa_family))));
                      pcVar23 = argv[iVar5];
                      sVar10 = strlen(pcVar23);
                      if ((pcVar12 != pcVar23 + sVar10) ||
                         (uVar9 != 0 && uVar9 - 0x10000 < 0xffffffffffff0401)) {
                        curl_mfprintf(_stderr,"socksd: invalid --port argument (%s)\n",pcVar23);
                        return 0;
                      }
                      port = curlx_ultous(uVar9);
                      pcVar23 = local_658;
                      iVar5 = iVar7 + 2;
                    }
                    goto LAB_001050df;
                  }
                  ipv_inuse = "IPv4";
                  use_ipv6 = 0;
                }
                iVar5 = iVar7 + 1;
              }
            }
          }
        }
      }
LAB_001050df:
      iVar7 = iVar5;
    } while (iVar7 < argc);
  }
  old_sighup_handler = (SIGHANDLER_T)signal(1,(__sighandler_t)0x1);
  if (old_sighup_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    logmsg("cannot install SIGHUP handler: %s",pcVar12);
  }
  old_sigpipe_handler = (SIGHANDLER_T)signal(0xd,(__sighandler_t)0x1);
  if (old_sigpipe_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    logmsg("cannot install SIGPIPE handler: %s",pcVar12);
  }
  old_sigalrm_handler = (SIGHANDLER_T)signal(0xe,(__sighandler_t)0x1);
  if (old_sigalrm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    logmsg("cannot install SIGALRM handler: %s",pcVar12);
  }
  old_sigint_handler = (SIGHANDLER_T)signal(2,exit_signal_handler);
  if (old_sigint_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    logmsg("cannot install SIGINT handler: %s",pcVar12);
  }
  else {
    siginterrupt(2,1);
  }
  uVar6 = socket((uint)use_ipv6 * 8 + 2,1,0);
  if (uVar6 == 0xffffffff) {
    puVar13 = (uint *)__errno_location();
    uVar6 = *puVar13;
    pcVar23 = strerror(uVar6);
    logmsg("Error creating socket: (%d) %s",(ulong)uVar6,pcVar23);
    goto LAB_001053de;
  }
  local_348 = 1;
  iVar7 = setsockopt(uVar6,1,2,&local_348,4);
  if (iVar7 == 0) {
LAB_001052ec:
    if (use_ipv6 == 0) {
      local_238.sa_data[6] = '\0';
      local_238.sa_data[7] = '\0';
      local_238.sa_data[8] = '\0';
      local_238.sa_data[9] = '\0';
      local_238.sa_data[10] = '\0';
      local_238.sa_data[0xb] = '\0';
      local_238.sa_data[0xc] = '\0';
      local_238.sa_data[0xd] = '\0';
      __len = 0x10;
      local_238.sa_family._0_1_ = 2;
    }
    else {
      uStack_220 = 0;
      local_238.sa_data._6_4_ = SUB84(_in6addr_any,0);
      local_238.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_228 = (undefined4)_poll;
      uStack_224 = (undefined4)((ulong)_poll >> 0x20);
      __len = 0x1c;
      local_238.sa_family._0_1_ = 10;
    }
    local_238.sa_data[4] = '\0';
    local_238.sa_data[5] = '\0';
    local_238.sa_data[2] = '\0';
    local_238.sa_data[3] = '\0';
    local_238.sa_family._1_1_ = 0;
    local_238.sa_data._0_2_ = port << 8 | port >> 8;
    iVar7 = bind(uVar6,&local_238,__len);
    if (iVar7 == 0) {
      if (port == 0) {
        sVar10 = 0x10;
        if (use_ipv6 != 0) {
          sVar10 = 0x1c;
        }
        local_5d8.fds_bits[0] = CONCAT44(local_5d8.fds_bits[0]._4_4_,(int)sVar10);
        memset(local_558,0,sVar10);
        iVar7 = getsockname(uVar6,local_558,(socklen_t *)&local_5d8);
        if (iVar7 < 0) {
          puVar13 = (uint *)__errno_location();
          uVar19 = *puVar13;
          pcVar23 = strerror(uVar19);
          pcVar12 = "getsockname() failed with error: (%d) %s";
          goto LAB_0010527f;
        }
        if ((local_558[0].sa_family == 10) || (local_558[0].sa_family == 2)) {
          port = local_558[0].sa_data._0_2_ << 8 | (ushort)local_558[0].sa_data._0_2_ >> 8;
        }
        if (port == 0) {
          logmsg("Apparently getsockname() succeeded, with listener port zero.");
          logmsg("A valid reason for this failure is a binary built without");
          logmsg("proper network library linkage. This might not be the only");
          pcVar23 = "reason, but double check it before anything else.";
          goto LAB_001052e0;
        }
      }
      iVar7 = listen(uVar6,5);
      if (iVar7 == 0) {
        logmsg("Running %s version",ipv_inuse);
        logmsg("Listening on port %hu",(ulong)port);
        iVar7 = write_pidfile(pcVar23);
        if (iVar7 != 0) {
          auStack_630[3] = 0;
          auStack_630[4] = 0;
          auStack_630[1] = 0;
          auStack_630[2] = 0;
          local_638[0] = 0;
          local_638[1] = 0;
          auStack_630[0] = 0;
          local_648[0] = 0;
          local_648[1] = 0;
          if (got_exit_signal == 0) {
            uVar19 = uVar6 + 0x3f;
            if (-1 < (int)uVar6) {
              uVar19 = uVar6;
            }
            local_68c = 0;
            uVar9 = 1L << ((byte)uVar6 & 0x3f);
LAB_00105648:
            local_5d8.fds_bits[0xe] = 0;
            local_5d8.fds_bits[0xf] = 0;
            local_5d8.fds_bits[0xc] = 0;
            local_5d8.fds_bits[0xd] = 0;
            local_5d8.fds_bits[10] = 0;
            local_5d8.fds_bits[0xb] = 0;
            local_5d8.fds_bits[8] = 0;
            local_5d8.fds_bits[9] = 0;
            local_5d8.fds_bits[6] = 0;
            local_5d8.fds_bits[7] = 0;
            local_5d8.fds_bits[4] = 0;
            local_5d8.fds_bits[5] = 0;
            local_5d8.fds_bits[2] = 0;
            local_5d8.fds_bits[3] = 0;
            local_5d8.fds_bits[0] = 0;
            local_5d8.fds_bits[1] = 0;
            local_3c8.fds_bits[0] = 0;
            local_3c8.fds_bits[1] = 0;
            local_3c8.fds_bits[2] = 0;
            local_3c8.fds_bits[3] = 0;
            local_3c8.fds_bits[4] = 0;
            local_3c8.fds_bits[5] = 0;
            local_3c8.fds_bits[6] = 0;
            local_3c8.fds_bits[7] = 0;
            local_3c8.fds_bits[8] = 0;
            local_3c8.fds_bits[9] = 0;
            local_3c8.fds_bits[10] = 0;
            local_3c8.fds_bits[0xb] = 0;
            local_3c8.fds_bits[0xc] = 0;
            local_3c8.fds_bits[0xd] = 0;
            local_3c8.fds_bits[0xe] = 0;
            local_3c8.fds_bits[0xf] = 0;
            local_448.fds_bits[0] = 0;
            local_448.fds_bits[1] = 0;
            local_448.fds_bits[2] = 0;
            local_448.fds_bits[3] = 0;
            local_448.fds_bits[4] = 0;
            local_448.fds_bits[5] = 0;
            local_448.fds_bits[6] = 0;
            local_448.fds_bits[7] = 0;
            local_448.fds_bits[8] = 0;
            local_448.fds_bits[9] = 0;
            local_448.fds_bits[10] = 0;
            local_448.fds_bits[0xb] = 0;
            local_448.fds_bits[0xc] = 0;
            local_448.fds_bits[0xd] = 0;
            local_5d8.fds_bits[(int)uVar19 >> 6] = local_5d8.fds_bits[(int)uVar19 >> 6] | uVar9;
            local_448.fds_bits[0xe] = 0;
            local_448.fds_bits[0xf] = 0;
            puVar16 = local_648;
            uVar20 = uVar6;
            bVar2 = true;
            do {
              bVar3 = bVar2;
              if ((char)puVar16[3] == '\x01') {
                uVar8 = *(uint *)((long)puVar16 + 0x14);
                uVar22 = uVar8 + 0x3f;
                if (-1 < (int)uVar8) {
                  uVar22 = uVar8;
                }
                local_5d8.fds_bits[(int)uVar22 >> 6] =
                     local_5d8.fds_bits[(int)uVar22 >> 6] | 1L << ((byte)uVar8 & 0x3f);
                if ((int)uVar20 < (int)uVar8) {
                  uVar20 = uVar8;
                }
                uVar8 = (uint)puVar16[2];
                uVar22 = uVar8 + 0x3f;
                if (-1 < (int)uVar8) {
                  uVar22 = uVar8;
                }
                local_5d8.fds_bits[(int)uVar22 >> 6] =
                     local_5d8.fds_bits[(int)uVar22 >> 6] | 1L << ((byte)uVar8 & 0x3f);
                if ((int)uVar20 < (int)uVar8) {
                  uVar20 = uVar8;
                }
              }
              puVar16 = auStack_630 + 1;
              bVar2 = false;
            } while (bVar3);
            uVar8 = 0;
            while( true ) {
              uVar22 = uVar8;
              iVar7 = select(uVar20 + 1,&local_5d8,&local_3c8,&local_448,(timeval *)0x0);
              if (got_exit_signal != 0) goto LAB_00105559;
              if (iVar7 != -1) break;
              puVar13 = (uint *)__errno_location();
              uVar22 = *puVar13;
              uVar8 = 4;
              if (uVar22 != 4) goto LAB_001063de;
            }
            if (-1 < iVar7) {
              local_658 = pcVar23;
              local_5e0 = uVar9;
              if ((local_68c < 2) && ((local_5d8.fds_bits[(int)uVar19 >> 6] & uVar9) != 0)) {
                uVar20 = accept(uVar6,(sockaddr *)0x0,(socklen_t *)0x0);
                if (uVar20 == 0xffffffff) {
                  puVar13 = (uint *)__errno_location();
                  uVar20 = *puVar13;
                  pcVar23 = strerror(uVar20);
                  logmsg("accept(%d, NULL, NULL) failed with error: (%d) %s",(ulong)uVar6,
                         (ulong)uVar20,pcVar23);
                  goto LAB_00105d31;
                }
                logmsg("====> Client connect, fd %d. Read config from %s",(ulong)uVar20,configfile);
                __stream = fopen64(configfile,"r");
                logmsg("Reset to defaults");
                config.version = '\x05';
                config.nmethods_min = '\x01';
                config.nmethods_max = '\x03';
                config.responseversion = '\x05';
                config.responsemethod = '\0';
                config.reqcmd = '\x01';
                config.connectrep = '\0';
                config.port = backendport;
                strcpy(config.addr,backendaddr);
                builtin_strncpy(config.user,"user",5);
                builtin_strncpy(config.password,"password",9);
                if (__stream != (FILE *)0x0) {
                  logmsg("parse config file");
LAB_001058e6:
                  do {
                    pcVar23 = fgets((char *)&local_238,0x200,__stream);
                    if (pcVar23 == (char *)0x0) goto LAB_00105bc5;
                    iVar7 = __isoc99_sscanf(&local_238,"%31s %31s",&local_678);
                    if (iVar7 == 2) {
                      lVar1 = CONCAT17(uStack_671,
                                       CONCAT25(uStack_673,CONCAT14(cStack_674,local_678)));
                      if (lVar1 == 0x6e6f6973726576) {
                        uVar9 = strtoul(local_608,(char **)0x0,10);
                        config.version = (uchar)uVar9;
                        uVar9 = uVar9 & 0xff;
                        pcVar23 = "version [%d] set";
                      }
                      else if (CONCAT17(uStack_66c,
                                        CONCAT43(local_670,CONCAT12(uStack_671,uStack_673))) ==
                               0x6e696d5f73646f &&
                               CONCAT17(uStack_671,
                                        CONCAT25(uStack_673,CONCAT14(cStack_674,local_678))) ==
                               0x73646f6874656d6e) {
                        uVar9 = strtoul(local_608,(char **)0x0,10);
                        config.nmethods_min = (uchar)uVar9;
                        uVar9 = uVar9 & 0xff;
                        pcVar23 = "nmethods_min [%d] set";
                      }
                      else if (CONCAT17(uStack_66c,
                                        CONCAT43(local_670,CONCAT12(uStack_671,uStack_673))) ==
                               0x78616d5f73646f &&
                               CONCAT17(uStack_671,
                                        CONCAT25(uStack_673,CONCAT14(cStack_674,local_678))) ==
                               0x73646f6874656d6e) {
                        uVar9 = strtoul(local_608,(char **)0x0,10);
                        config.nmethods_max = (uchar)uVar9;
                        uVar9 = uVar9 & 0xff;
                        pcVar23 = "nmethods_max [%d] set";
                      }
                      else {
                        if (lVar1 == 0x646e656b636162) {
                          strcpy(config.addr,local_608);
                          logmsg("backend [%s] set",0x10a626);
                          goto LAB_001058e6;
                        }
                        if (local_670 != 0x74726f ||
                            CONCAT17(uStack_671,CONCAT25(uStack_673,CONCAT14(cStack_674,local_678)))
                            != 0x70646e656b636162) {
                          if (cStack_674 == '\0' && local_678 == 0x72657375) {
                            uVar24 = 0x10a646;
                            strcpy(config.user,local_608);
                            pcVar23 = "user [%s] set";
                          }
                          else {
                            if ((char)local_670 != '\0' ||
                                CONCAT17(uStack_671,
                                         CONCAT25(uStack_673,CONCAT14(cStack_674,local_678))) !=
                                0x64726f7773736170) {
                              if (CONCAT22(uStack_673,CONCAT11(cStack_674,local_678._3_1_)) ==
                                  0x646f68 && local_678 == 0x6874656d) {
                                uVar9 = strtoul(local_608,(char **)0x0,10);
                                config.responsemethod = (uchar)uVar9;
                                logmsg("method [%d] set",uVar9 & 0xff);
                              }
                              else if ((char)local_670 == '\0' &&
                                       CONCAT17(uStack_671,
                                                CONCAT25(uStack_673,CONCAT14(cStack_674,local_678)))
                                       == 0x65736e6f70736572) {
                                uVar9 = strtoul(local_608,(char **)0x0,10);
                                config.connectrep = (uchar)uVar9;
                                uVar9 = uVar9 & 0xff;
                                pcVar23 = "response [%d] set";
                                goto LAB_00105b32;
                              }
                              goto LAB_001058e6;
                            }
                            uVar24 = 0x10a746;
                            strcpy(config.password,local_608);
                            pcVar23 = "password [%s] set";
                          }
                          logmsg(pcVar23,uVar24);
                          goto LAB_001058e6;
                        }
                        uVar9 = strtoul(local_608,(char **)0x0,10);
                        config.port = (unsigned_short)uVar9;
                        uVar9 = uVar9 & 0xffff;
                        pcVar23 = "backendport [%d] set";
                      }
LAB_00105b32:
                      logmsg(pcVar23,uVar9);
                    }
                  } while( true );
                }
                goto LAB_00105bcd;
              }
              goto LAB_00105d31;
            }
LAB_001063de:
            pcVar12 = strerror(uVar22);
            logmsg("select() failed with error: (%d) %s",(ulong)uVar22,pcVar12);
            goto LAB_00105567;
          }
LAB_00105559:
          logmsg("signalled to die, exiting...");
LAB_00105567:
          close(uVar6);
          unlink(pcVar23);
          goto LAB_001053de;
        }
        goto LAB_001053d6;
      }
      puVar13 = (uint *)__errno_location();
      uVar19 = *puVar13;
      pcVar23 = strerror(uVar19);
      pcVar12 = "listen(%d, 5) failed with error: (%d) %s";
      uVar20 = uVar6;
    }
    else {
      puVar13 = (uint *)__errno_location();
      uVar19 = *puVar13;
      uVar20 = (uint)port;
      pcVar23 = strerror(uVar19);
      pcVar12 = "Error binding socket on port %hu: (%d) %s";
    }
    logmsg(pcVar12,(ulong)uVar20,(ulong)uVar19,pcVar23);
  }
  else {
    puVar13 = (uint *)__errno_location();
    uVar19 = *puVar13;
    pcVar12 = strerror(uVar19);
    logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",(ulong)uVar19,pcVar12);
    iVar7 = wait_ms(0x14);
    if (iVar7 == 0) {
      if (got_exit_signal == 0) goto LAB_001052ec;
      pcVar23 = "signalled to die, exiting...";
LAB_001052e0:
      logmsg(pcVar23);
    }
    else {
      uVar19 = *puVar13;
      pcVar23 = strerror(uVar19);
      pcVar12 = "wait_ms() failed with error: (%d) %s";
LAB_0010527f:
      logmsg(pcVar12,(ulong)uVar19,pcVar23);
    }
  }
LAB_001053d6:
  close(uVar6);
LAB_001053de:
  if (old_sighup_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(1,(__sighandler_t)old_sighup_handler);
  }
  if (old_sigpipe_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xd,(__sighandler_t)old_sigpipe_handler);
  }
  if (old_sigalrm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xe,(__sighandler_t)old_sigalrm_handler);
  }
  if (old_sigint_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(2,(__sighandler_t)old_sigint_handler);
  }
  if (got_exit_signal != 0) {
    logmsg("============> socksd exits with signal (%d)",(ulong)(uint)exit_signal);
    raise(exit_signal);
  }
  logmsg("============> socksd quits");
  return 0;
LAB_00105bc5:
  fclose(__stream);
LAB_00105bcd:
  sVar14 = recv(uVar20,local_558,0x110,0);
  logmsg("READ %d bytes",sVar14);
  loghex((uchar *)local_558,sVar14);
  if ((byte)local_558[0].sa_family == '\x04') {
    if (local_558[0].sa_family._1_1_ == 1) {
      if (sVar14 < 9) {
        logmsg("SOCKS4 connect message too short: %d",sVar14);
        goto LAB_00105ccb;
      }
      connectport_00 = local_558[0].sa_data._0_2_ << 8 | (ushort)local_558[0].sa_data._0_2_ >> 8;
      if (config.port != 0) {
        connectport_00 = config.port;
      }
      uVar8 = socksconnect(connectport_00,(char *)(ulong)local_558[0].sa_family._1_1_);
      local_238.sa_family._1_1_ = uVar8 == 0xffffffff | 0x5a;
      local_238.sa_family._0_1_ = 0;
      local_238.sa_data._0_2_ = SUB42(local_558[0].sa_data._0_4_,0);
      local_238.sa_data._2_2_ = SUB42(local_558[0].sa_data._0_4_,2);
      local_238.sa_data[4] = local_558[0].sa_data[4];
      local_238.sa_data[5] = local_558[0].sa_data[5];
      sVar14 = send(uVar20,&local_238,8,0);
      if (sVar14 != 8) {
        logmsg("Sending SOCKS4 response failed!");
        goto LAB_00105ccb;
      }
      logmsg("Sent %d bytes",8);
      loghex((uchar *)&local_238,8);
    }
    else {
      logmsg("SOCKS4 CD is not 1: %d");
LAB_00105ccb:
      uVar8 = 0xffffffff;
    }
LAB_00105cd0:
    if (uVar8 != 0xffffffff) {
      logmsg("====> Tunnel transfer");
      uVar9 = auStack_630[0] & 0xff;
      local_648[uVar9 * 4] = 0;
      local_648[uVar9 * 4 + 1] = 0;
      local_638[uVar9 * 8 + 1] = uVar20;
      local_638[uVar9 * 8] = uVar8;
      *(undefined1 *)(auStack_630 + uVar9 * 4) = 1;
      local_68c = local_68c + 1;
      goto LAB_00105d31;
    }
  }
  else {
    pcVar23 = (char *)(ulong)config.version;
    if ((byte)local_558[0].sa_family != config.version) {
      pcVar12 = "VERSION byte not %d";
      goto LAB_00105d0d;
    }
    if (config.nmethods_max < local_558[0].sa_family._1_1_ ||
        local_558[0].sa_family._1_1_ < config.nmethods_min) {
      logmsg("NMETHODS byte not within %d - %d ",(ulong)config.nmethods_min,
             (ulong)config.nmethods_max);
    }
    else if (sVar14 == (ulong)local_558[0].sa_family._1_1_ + 2) {
      logmsg("Incoming request deemed fine!");
      local_348 = CONCAT22(local_348._2_2_,CONCAT11(config.responsemethod,config.responseversion));
      sVar14 = send(uVar20,&local_348,2,0);
      if (sVar14 == 2) {
        logmsg("Sent %d bytes",2);
        loghex((uchar *)&local_348,2);
        uVar9 = recv(uVar20,local_558,0x110,0);
        logmsg("READ %d bytes",uVar9);
        loghex((uchar *)local_558,uVar9);
        if (config.responsemethod == '\x02') {
          if ((long)uVar9 < 5) {
            pcVar23 = "Too short auth input: %d";
          }
          else {
            pcVar23 = (char *)(ulong)(byte)local_558[0].sa_family;
            if ((byte)local_558[0].sa_family != 1) {
              pcVar12 = "Auth VERSION byte not 1, got %d";
              goto LAB_00105d0d;
            }
            uVar21 = (ulong)local_558[0].sa_family._1_1_;
            if (uVar21 + 4 <= uVar9) {
              __n = (ulong)(byte)local_558[0].sa_data[uVar21];
              if (uVar9 < local_558[0].sa_family._1_1_ + 3 +
                          (uint)(byte)local_558[0].sa_data[uVar21]) {
                logmsg("Too short packet for ulen %d plen %d: %d",uVar21,__n,uVar9);
              }
              else {
                sVar10 = strlen(config.user);
                if ((((sVar10 == uVar21) && (sVar10 = strlen(config.password), sVar10 == __n)) &&
                    (iVar7 = bcmp(local_558[0].sa_data,config.user,uVar21), iVar7 == 0)) &&
                   (iVar7 = bcmp(local_558[0].sa_data + uVar21 + 1,config.password,__n), iVar7 == 0)
                   ) {
                  cVar17 = '\x01';
                }
                else {
                  cVar17 = '\0';
                  logmsg("mismatched credentials!");
                }
                local_348 = CONCAT22(local_348._2_2_,CONCAT11(cVar17,1)) ^ 0x100;
                sVar14 = send(uVar20,&local_348,2,0);
                if (sVar14 != 2) {
                  pcVar23 = "Sending auth response failed!";
                  goto LAB_0010605b;
                }
                logmsg("Sent %d bytes",2);
                loghex((uchar *)&local_348,2);
                if (cVar17 != '\0') {
                  uVar9 = recv(uVar20,local_558,0x110,0);
                  logmsg("READ %d bytes",uVar9);
                  loghex((uchar *)local_558,uVar9);
                  goto LAB_001061df;
                }
              }
              goto LAB_00105d17;
            }
            pcVar23 = "Too short packet for username: %d";
          }
        }
        else {
LAB_001061df:
          if (5 < (long)uVar9) {
            pcVar23 = (char *)(ulong)config.version;
            if ((byte)local_558[0].sa_family == config.version) {
              pcVar23 = (char *)(ulong)config.reqcmd;
              if ((local_558[0].sa_family._1_1_ == config.reqcmd) &&
                 (local_558[0].sa_data[0] == '\0')) {
                cVar17 = local_558[0].sa_data[1];
                if (local_558[0].sa_data[1] == 1) {
                  bVar4 = 4;
                }
                else if (local_558[0].sa_data[1] == 4) {
                  bVar4 = 0x10;
                }
                else {
                  if ((byte)local_558[0].sa_data[1] != 3) {
                    pcVar12 = "Unknown ATYP %d";
                    pcVar23 = (char *)(ulong)(uint)(byte)local_558[0].sa_data[1];
                    goto LAB_00105d0d;
                  }
                  bVar4 = local_558[0].sa_data[2] + 1;
                }
                local_650 = (ulong)bVar4;
                uVar21 = (ulong)(bVar4 + 6);
                if (uVar9 < uVar21) {
                  logmsg("Request too short: %d, expected %d",uVar9,uVar21);
                }
                else {
                  connectport = config.port;
                  if (connectport == 0) {
                    connectport = *(ushort *)(local_558[0].sa_data + local_650 + 2) << 8 |
                                  *(ushort *)(local_558[0].sa_data + local_650 + 2) >> 8;
                  }
                  uVar8 = 0xffffffff;
                  if (config.connectrep == '\0') {
                    uVar8 = socksconnect(connectport,pcVar23);
                  }
                  uVar9 = local_650;
                  uVar18 = config.connectrep;
                  if (uVar8 == 0xffffffff) {
                    uVar18 = '\x01';
                  }
                  local_348._0_3_ = (uint3)CONCAT11(uVar18,config.responseversion);
                  local_348 = CONCAT13(cVar17,(uint3)local_348);
                  memcpy(local_344,local_558[0].sa_data + 2,local_650);
                  *(undefined2 *)((long)local_344 + uVar9) =
                       *(undefined2 *)(local_558[0].sa_data + uVar9 + 2);
                  uVar9 = send(uVar20,&local_348,uVar21,0);
                  if (uVar9 != uVar21) {
                    pcVar23 = "Sending connect response failed!";
                    goto LAB_0010605b;
                  }
                  logmsg("Sent %d bytes",uVar21);
                  loghex((uchar *)&local_348,uVar21);
                  if (uVar18 == '\0' || uVar8 == 0xffffffff) {
                    uVar8 = -(uint)(uVar18 != '\0') | uVar8;
                    goto LAB_00105cd0;
                  }
                  close(uVar8);
                }
                goto LAB_00105d17;
              }
              pcVar12 = "Request COMMAND byte not %d";
            }
            else {
              pcVar12 = "Request VERSION byte not %d";
            }
LAB_00105d0d:
            logmsg(pcVar12,pcVar23);
            goto LAB_00105d17;
          }
          pcVar23 = "Too short for request: %d";
        }
        logmsg(pcVar23,uVar9);
      }
      else {
        pcVar23 = "Sending response failed!";
LAB_0010605b:
        logmsg(pcVar23);
      }
    }
    else {
      logmsg("Expected %d bytes, got %d",(ulong)local_558[0].sa_family._1_1_ + 2,sVar14);
    }
  }
LAB_00105d17:
  logmsg("====> Client disconnect");
  close(uVar20);
LAB_00105d31:
  puVar16 = local_648;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    if ((char)puVar16[3] == '\x01') {
      uVar20 = *(uint *)((long)puVar16 + 0x14);
      uVar8 = uVar20 + 0x3f;
      if (-1 < (int)uVar20) {
        uVar8 = uVar20;
      }
      if (((ulong)local_5d8.fds_bits[(int)uVar8 >> 6] >> ((ulong)uVar20 & 0x3f) & 1) == 0) {
        uVar8 = (uint)puVar16[2];
LAB_00105dc7:
        uVar22 = uVar8 + 0x3f;
        if (-1 < (int)uVar8) {
          uVar22 = uVar8;
        }
        if (((ulong)local_5d8.fds_bits[(int)uVar22 >> 6] >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
          sVar10 = recv(uVar8,&local_238,0x200,0);
          if (((long)sVar10 < 1) || (sVar15 = send(uVar20,&local_238,sVar10,0), sVar15 != sVar10))
          goto LAB_00105e21;
          *puVar16 = *puVar16 + sVar10;
        }
      }
      else {
        sVar10 = recv(uVar20,&local_238,0x200,0);
        if (0 < (long)sVar10) {
          uVar8 = (uint)puVar16[2];
          sVar15 = send(uVar8,&local_238,sVar10,0);
          if (sVar15 == sVar10) {
            puVar16[1] = puVar16[1] + sVar10;
            goto LAB_00105dc7;
          }
        }
LAB_00105e21:
        logmsg("SOCKS transfer completed. Bytes: < %zu > %zu",*puVar16,puVar16[1]);
        close(uVar20);
        close((int)puVar16[2]);
        *(undefined1 *)(puVar16 + 3) = 0;
        local_68c = local_68c + -1;
      }
    }
    puVar16 = auStack_630 + 1;
    bVar2 = false;
  } while (bVar3);
  uVar9 = local_5e0;
  pcVar23 = local_658;
  if (local_68c != 0) goto LAB_00105648;
  auStack_630[3] = 0;
  auStack_630[4] = 0;
  auStack_630[1] = 0;
  auStack_630[2] = 0;
  local_638[0] = 0;
  local_638[1] = 0;
  auStack_630[0] = 0;
  local_648[0] = 0;
  local_648[1] = 0;
  local_68c = 0;
  if (got_exit_signal != 0) goto LAB_00105559;
  goto LAB_00105648;
}

Assistant:

int main(int argc, char *argv[])
{
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  const char *pidname = ".socksd.pid";
  bool juggle_again;
  int error;
  int arg = 1;

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("socksd IPv4%s\n",
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--config", argv[arg])) {
      arg++;
      if(argc>arg)
        configfile = argv[arg++];
    }
    else if(!strcmp("--backend", argv[arg])) {
      arg++;
      if(argc>arg)
        backendaddr = argv[arg++];
    }
    else if(!strcmp("--backendport", argv[arg])) {
      arg++;
      if(argc>arg)
        backendport = (unsigned short)atoi(argv[arg++]);
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv4", argv[arg])) {
      /* for completeness, we support this option as well */
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           ((ulnum != 0UL) && ((ulnum < 1025UL) || (ulnum > 65535UL)))) {
          fprintf(stderr, "socksd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else {
      puts("Usage: socksd [option]\n"
           " --backend [ipv4 addr]\n"
           " --backendport [TCP port]\n"
           " --config [file]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --bindonly\n"
           " --port [port]\n");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);

  setmode(fileno(stdin), O_BINARY);
  setmode(fileno(stdout), O_BINARY);
  setmode(fileno(stderr), O_BINARY);
#endif

  install_signal_handlers();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto socks5_cleanup;
  }

  {
    /* passive daemon style */
    sock = sockdaemon(sock, &port);
    if(CURL_SOCKET_BAD == sock) {
      goto socks5_cleanup;
    }
    msgsock = CURL_SOCKET_BAD; /* no stream socket yet */
  }

  logmsg("Running %s version", ipv_inuse);
  logmsg("Listening on port %hu", port);

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile) {
    goto socks5_cleanup;
  }

  do {
    juggle_again = incoming(sock);
  } while(juggle_again);

socks5_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(wrotepidfile)
    unlink(pidname);

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("============> socksd exits with signal (%d)", exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("============> socksd quits");
  return 0;
}